

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

void __thiscall roaring::Roaring64Map::add(Roaring64Map *this,uint32_t x)

{
  Roaring *this_00;
  
  this_00 = lookupOrCreateInner(this,0);
  Roaring::add(this_00,x);
  return;
}

Assistant:

void add(uint32_t x) { lookupOrCreateInner(0).add(x); }